

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  pointer ppVar6;
  int n_00;
  quadratic_cost_type<double> *this_00;
  pointer ppVar7;
  pointer ppVar8;
  undefined8 extraout_RAX;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  pointer ppVar12;
  pointer ppVar13;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  q;
  allocator_type local_79;
  double local_78;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_70;
  int local_54;
  quadratic_cost_type<double> *local_50;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            (&local_70,(long)n,(allocator_type *)&local_48);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::vector(&local_48,
           (long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_79);
  ppVar8 = local_70.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = local_70.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    pdVar5 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    piVar9 = &(local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    uVar10 = 0;
    do {
      ((pair<double,_int> *)(piVar9 + -2))->first = pdVar5[uVar10];
      *piVar9 = (int)uVar10;
      uVar10 = uVar10 + 1;
      piVar9 = piVar9 + 4;
    } while ((uint)n != uVar10);
  }
  ppVar13 = local_70.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  n_00 = n;
  this_00 = this;
  if (local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_54 = n;
    local_50 = this;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_70.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar6,ppVar8);
    ppVar6 = local_70.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar13 = local_70.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar8 = local_70.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    n_00 = local_54;
    this_00 = local_50;
  }
  for (; ppVar7 = local_70.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_54 = n_00, local_50 = this_00,
      ppVar6 != local_70.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
    dVar1 = ppVar6->first;
    dVar14 = ppVar13->first;
    if (((dVar1 != dVar14) ||
        (ppVar12 = ppVar13,
        local_70.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar8, NAN(dVar1) || NAN(dVar14))) &&
       (ppVar12 = ppVar6,
       local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish = ppVar8, 0x10 < (long)ppVar6 - (long)ppVar13)) {
      local_78 = dVar1 - dVar14;
      do {
        auVar15._0_8_ =
             std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
        auVar15._8_56_ = extraout_var;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_78;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar14;
        auVar2 = vfmadd213sd_fma(auVar15._0_16_,auVar18,auVar2);
        ppVar13->first = auVar2._0_8_;
        ppVar13 = ppVar13 + 1;
      } while (ppVar13 != ppVar6);
    }
    ppVar13 = ppVar12;
    ppVar8 = local_70.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    n_00 = local_54;
    this_00 = local_50;
    local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  if (0x10 < (long)local_70.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13) {
    if ((long)ppVar13 -
        (long)local_70.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      dVar1 = ppVar13->first;
      dVar14 = dVar1 + 1.0;
      if ((dVar1 == dVar14) && (!NAN(dVar1) && !NAN(dVar14))) goto LAB_00180d4b;
      if (ppVar13 !=
          local_70.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_78 = dVar14 - dVar1;
        local_70.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar8;
        do {
          auVar17._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar17._8_56_ = extraout_var_01;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_78;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar17._0_16_,auVar20,auVar4);
          ppVar13->first = auVar2._0_8_;
          ppVar13 = ppVar13 + 1;
          ppVar8 = local_70.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar13 != ppVar7);
      }
    }
    else {
      local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar8;
      dVar14 = linearize<long,double>
                         (0,(local_70.
                             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar13 -
                          (long)local_70.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,ppVar13->first,
                          (long)ppVar8 -
                          (long)local_70.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4);
      dVar1 = ppVar13->first;
      if ((dVar1 == dVar14) && (!NAN(dVar1) && !NAN(dVar14))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_00180d4b:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_70.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar8 = local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar13 != ppVar7) {
        local_78 = dVar14 - dVar1;
        do {
          auVar16._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar16._8_56_ = extraout_var_00;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_78;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar16._0_16_,auVar19,auVar3);
          ppVar13->first = auVar2._0_8_;
          ppVar13 = ppVar13 + 1;
          ppVar8 = local_70.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar13 != ppVar7);
      }
    }
  }
  local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar8;
  ppVar6 = local_70.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_70.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar6,local_70.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (n_00 != 0) {
    pdVar5 = (this_00->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)pdVar5 + lVar11) =
           *(undefined8 *)
            ((long)&(local_70.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar11 * 2);
      lVar11 = lVar11 + 8;
    } while ((ulong)(uint)n << 3 != lVar11);
  }
  make_loo_norm(this_00,n_00);
  if (local_48.
      super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }